

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meter.cc
# Opt level: O0

double __thiscall fasttext::Meter::log(Meter *this,double __x)

{
  bool bVar1;
  size_type sVar2;
  mapped_type *pmVar3;
  vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *in_RDX;
  vector<int,_std::allocator<int>_> *in_RSI;
  double extraout_XMM0_Qa;
  int *label;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<int,_std::allocator<int>_> *__range1_1;
  pair<float,_int> *prediction;
  const_iterator __end1;
  const_iterator __begin1;
  Predictions *__range1;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff98;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffffb8;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffc0;
  __normal_iterator<const_std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
  local_28;
  vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *local_20;
  vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *local_18;
  Meter *local_8;
  
  this->nexamples_ = this->nexamples_ + 1;
  local_18 = in_RDX;
  local_8 = this;
  sVar2 = std::vector<int,_std::allocator<int>_>::size(in_RSI);
  (this->metrics_).gold = sVar2 + (this->metrics_).gold;
  sVar2 = std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::size
                    (local_18);
  (this->metrics_).predicted = sVar2 + (this->metrics_).predicted;
  local_20 = local_18;
  local_28._M_current =
       (pair<float,_int> *)
       std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::begin
                 ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
                  in_stack_ffffffffffffff98);
  std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::end
            ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
             in_stack_ffffffffffffff98);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
                             *)this,(__normal_iterator<const_std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
                                     *)in_stack_ffffffffffffff98), bVar1) {
    __gnu_cxx::
    __normal_iterator<const_std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
    ::operator*(&local_28);
    pmVar3 = std::
             unordered_map<int,_fasttext::Meter::Metrics,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>_>
             ::operator[]((unordered_map<int,_fasttext::Meter::Metrics,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>_>
                           *)this,(key_type *)in_stack_ffffffffffffff98);
    pmVar3->predicted = pmVar3->predicted + 1;
    bVar1 = utils::contains<int>(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8._M_current);
    if (bVar1) {
      pmVar3 = std::
               unordered_map<int,_fasttext::Meter::Metrics,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>_>
               ::operator[]((unordered_map<int,_fasttext::Meter::Metrics,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>_>
                             *)this,(key_type *)in_stack_ffffffffffffff98);
      pmVar3->predictedGold = pmVar3->predictedGold + 1;
      (this->metrics_).predictedGold = (this->metrics_).predictedGold + 1;
    }
    __gnu_cxx::
    __normal_iterator<const_std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
    ::operator++(&local_28);
  }
  std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff98);
  std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffff98);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                             *)this,(__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                     *)in_stack_ffffffffffffff98), bVar1) {
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
              ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
               &stack0xffffffffffffffb8);
    pmVar3 = std::
             unordered_map<int,_fasttext::Meter::Metrics,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>_>
             ::operator[]((unordered_map<int,_fasttext::Meter::Metrics,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>_>
                           *)this,(key_type *)in_stack_ffffffffffffff98);
    pmVar3->gold = pmVar3->gold + 1;
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
               &stack0xffffffffffffffb8);
  }
  return extraout_XMM0_Qa;
}

Assistant:

void Meter::log(
    const std::vector<int32_t>& labels,
    const Predictions& predictions) {
  nexamples_++;
  metrics_.gold += labels.size();
  metrics_.predicted += predictions.size();

  for (const auto& prediction : predictions) {
    labelMetrics_[prediction.second].predicted++;

    if (utils::contains(labels, prediction.second)) {
      labelMetrics_[prediction.second].predictedGold++;
      metrics_.predictedGold++;
    }
  }

  for (const auto& label : labels) {
    labelMetrics_[label].gold++;
  }
}